

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O1

int jpc_cod_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  uint_fast16_t *val;
  int iVar1;
  int in_ECX;
  int iVar2;
  jpc_coxcp_t *in_R8;
  
  iVar1 = jpc_getuint8(in,(uint_fast8_t *)&(ms->parms).soc);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar1 = jpc_getuint8(in,&(ms->parms).cod.prg);
    if (iVar1 == 0) {
      val = &(ms->parms).cod.numlyrs;
      iVar1 = jpc_getuint16(in,val);
      if (iVar1 == 0) {
        iVar1 = jpc_getuint8(in,&(ms->parms).sot.partno);
        if ((iVar1 == 0) && (0xffffffffffff0000 < *val - 0x10000)) {
          iVar1 = jpc_cox_getcompparms
                            ((jpc_ms_t *)in,(jpc_cstate_t *)(ulong)((ms->parms).cod.csty & 1),
                             (jas_stream_t *)&(ms->parms).cod.compparms,in_ECX,in_R8);
          if (iVar1 == 0) {
            iVar2 = -(in->flags_ & 1U);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int jpc_cod_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_cod_t *cod = &ms->parms.cod;
	if (jpc_getuint8(in, &cod->csty)) {
		return -1;
	}
	if (jpc_getuint8(in, &cod->prg) ||
	  jpc_getuint16(in, &cod->numlyrs) ||
	  jpc_getuint8(in, &cod->mctrans)) {
		return -1;
	}
	if (cod->numlyrs < 1 || cod->numlyrs > 65535) {
		return -1;
	}
	if (jpc_cox_getcompparms(ms, cstate, in,
	  (cod->csty & JPC_COX_PRT) != 0, &cod->compparms)) {
		return -1;
	}
	if (jas_stream_eof(in)) {
		jpc_cod_destroyparms(ms);
		return -1;
	}
	return 0;
}